

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.h
# Opt level: O0

int sb_all_skip(CommonModeInfoParams *mi_params,int mi_row,int mi_col)

{
  int local_40;
  int local_3c;
  int c;
  int r;
  MB_MODE_INFO **mbmi;
  int stride;
  int maxc;
  int maxr;
  int mi_col_local;
  int mi_row_local;
  CommonModeInfoParams *mi_params_local;
  
  if (mi_params->mi_rows - mi_row < 0x10) {
    local_3c = mi_params->mi_rows - mi_row;
  }
  else {
    local_3c = 0x10;
  }
  if (mi_params->mi_cols - mi_col < 0x10) {
    local_40 = mi_params->mi_cols - mi_col;
  }
  else {
    local_40 = 0x10;
  }
  mbmi = mi_params->mi_grid_base + (long)(mi_row * mi_params->mi_stride) + (long)mi_col;
  r = 0;
  do {
    if (local_3c <= r) {
      return 1;
    }
    for (c = 0; c < local_40; c = c + 1) {
      if (mbmi[c]->skip_txfm == '\0') {
        return 0;
      }
    }
    r = r + 1;
    mbmi = mbmi + mi_params->mi_stride;
  } while( true );
}

Assistant:

static inline int sb_all_skip(const CommonModeInfoParams *const mi_params,
                              int mi_row, int mi_col) {
  const int maxr = AOMMIN(mi_params->mi_rows - mi_row, MI_SIZE_64X64);
  const int maxc = AOMMIN(mi_params->mi_cols - mi_col, MI_SIZE_64X64);
  const int stride = mi_params->mi_stride;
  MB_MODE_INFO **mbmi = mi_params->mi_grid_base + mi_row * stride + mi_col;
  for (int r = 0; r < maxr; ++r, mbmi += stride) {
    for (int c = 0; c < maxc; ++c) {
      if (!mbmi[c]->skip_txfm) return 0;
    }
  }
  return 1;
}